

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

int __thiscall
JsUtil::
BaseDictionary<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,RegexKey *key,MruDictionaryData *value)

{
  SimpleDictionaryEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
  *pSVar1;
  code *pcVar2;
  bool bVar3;
  hash_t hashCode_00;
  int iVar4;
  int **ppiVar5;
  SimpleDictionaryEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
  **ppSVar6;
  undefined4 *puVar7;
  uint local_5c;
  uint local_58;
  uint depth;
  int profileIndex;
  int index;
  int i;
  EntryType *localEntries;
  uint depth_1;
  uint targetBucket;
  hash_t hashCode;
  bool needSearch;
  int *localBuckets;
  MruDictionaryData *value_local;
  RegexKey *key_local;
  BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
  _hashCode = *ppiVar5;
  if (_hashCode == (int *)0x0) {
    BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
    _hashCode = *ppiVar5;
  }
  hashCode_00 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetHashCode(key);
  localEntries._4_4_ =
       BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       ::GetBucket((BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)this,hashCode_00);
  localEntries._0_4_ = 0;
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                      ((WriteBarrierPtr *)(this + 8));
  pSVar1 = *ppSVar6;
  index = _hashCode[localEntries._4_4_];
  while( true ) {
    if (index < 0) {
      if (*(long *)(this + 0x30) != 0) {
        DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),(uint)localEntries);
      }
      bVar3 = anon_unknown_5::
              ValueEntry<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>_>
              ::SupportsCleanup();
      if (((bVar3) && (*(int *)(this + 0x28) == 0)) &&
         (*(int *)(this + 0x20) == *(int *)(this + 0x18))) {
        MapAndRemoveIf<JsUtil::BaseDictionary<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::Insert<(JsUtil::BaseDictionary<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>(UnifiedRegex::RegexKey_const&,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData_const&)::_lambda(JsUtil::SimpleDictionaryEntry<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData>&)_1_>
                  (this);
      }
      if (*(int *)(this + 0x28) == 0) {
        if (*(int *)(this + 0x20) == *(int *)(this + 0x18)) {
          BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Resize((BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)this);
          localEntries._4_4_ =
               BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetBucket((BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                            *)this,hashCode_00);
          depth = *(uint *)(this + 0x20);
          *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
        }
        else {
          depth = *(uint *)(this + 0x20);
          *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
        }
        if (*(int *)(this + 0x18) < *(int *)(this + 0x20)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3f1,"(count <= size)","count <= size");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        if (*(int *)(this + 0x18) <= (int)depth) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3f2,"(index < size)","index < size");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
      else {
        if (*(int *)(this + 0x28) < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3d4,"(freeCount > 0)","freeCount > 0");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        if (*(int *)(this + 0x24) < 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3d5,"(freeList >= 0)","freeList >= 0");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3d6,"(freeList < count)","freeList < count");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        depth = *(uint *)(this + 0x24);
        *(int *)(this + 0x28) = *(int *)(this + 0x28) + -1;
        if (*(int *)(this + 0x28) != 0) {
          ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                              ((WriteBarrierPtr *)(this + 8));
          iVar4 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::GetNextFreeEntryIndex(*ppSVar6 + (int)depth);
          *(int *)(this + 0x24) = iVar4;
        }
      }
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                          ((WriteBarrierPtr *)(this + 8));
      DefaultHashedEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ::Set(&(*ppSVar6)[(int)depth].
             super_DefaultHashedEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            ,key,value,hashCode_00);
      ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
      iVar4 = (*ppiVar5)[localEntries._4_4_];
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                          ((WriteBarrierPtr *)(this + 8));
      (*ppSVar6)[(int)depth].
      super_DefaultHashedEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .
      super_KeyValueEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
      .
      super_ValueEntry<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>_>
      .
      super_KeyValueEntryDataLayout2<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
      .next = iVar4;
      ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
      (*ppiVar5)[localEntries._4_4_] = depth;
      local_58 = depth;
      local_5c = 1;
      while (ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                                 ((WriteBarrierPtr *)(this + 8)),
            (*ppSVar6)[(int)local_58].
            super_DefaultHashedEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .
            super_KeyValueEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
            .
            super_ValueEntry<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>_>
            .
            super_KeyValueEntryDataLayout2<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
            .next != -1) {
        ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                            ((WriteBarrierPtr *)(this + 8));
        local_58 = (*ppSVar6)[(int)local_58].
                   super_DefaultHashedEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .
                   super_KeyValueEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
                   .
                   super_ValueEntry<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>_>
                   .
                   super_KeyValueEntryDataLayout2<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
                   .next;
        local_5c = local_5c + 1;
      }
      if (*(long *)(this + 0x30) != 0) {
        DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),local_5c);
      }
      return depth;
    }
    bVar3 = DefaultHashedEntry<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,JsUtil::(anonymous_namespace)::KeyValueEntry>
            ::KeyEquals<DefaultComparer<UnifiedRegex::RegexKey>,UnifiedRegex::RegexKey>
                      ((DefaultHashedEntry<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,JsUtil::(anonymous_namespace)::KeyValueEntry>
                        *)(pSVar1 + index),key,hashCode_00);
    if (bVar3) break;
    localEntries._0_4_ = (uint)localEntries + 1;
    index = pSVar1[index].
            super_DefaultHashedEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .
            super_KeyValueEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
            .
            super_ValueEntry<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>_>
            .
            super_KeyValueEntryDataLayout2<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
            .next;
  }
  if (*(long *)(this + 0x30) != 0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),(uint)localEntries);
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                     ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
  if (bVar3) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
    return -1;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }